

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_offsets
               (NegativeTestContext *ctx)

{
  DataType DVar1;
  int iVar2;
  string shaderSource_00;
  bool bVar3;
  ContextType CVar4;
  char *pcVar5;
  long *plVar6;
  size_t sVar7;
  ostream *poVar8;
  int *piVar9;
  ostream *poVar10;
  NotSupportedError *this;
  ShaderType shaderType;
  size_type *psVar11;
  long lVar12;
  bool *pbVar13;
  _Alloc_hider _Var14;
  int iVar15;
  string shaderSource;
  ostringstream source;
  undefined8 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb40;
  ShaderType shaderType_00;
  size_type *local_4b8;
  string local_4a8;
  string local_488;
  char *local_468;
  long local_460;
  undefined4 local_458;
  undefined4 uStack_454;
  long *local_448 [2];
  long local_438 [2];
  string local_428;
  string local_408;
  string local_3e8;
  long *local_3c8;
  long local_3c0;
  long local_3b8 [2];
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  string local_388;
  string local_368;
  long local_348;
  string local_340;
  string local_320 [3];
  ios_base local_2b0 [264];
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  CVar4.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
  if (!bVar3) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"GL_EXT_gpu_shader5","");
    bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"This test requires a context version 3.2 or higher.",
                 "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_EXT_gpu_shader5\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
                 ,0x10c3);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_320[0]._M_dataplus._M_p = (pointer)&local_320[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"textureGatherOffsets","");
  NegativeTestContext::beginSection(ctx,local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  lVar12 = 0;
  do {
    shaderType_00 = (&(anonymous_namespace)::s_shaders)[lVar12];
    bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType_00);
    if (bVar3) {
      local_348 = lVar12;
      pcVar5 = glu::getShaderTypeName(shaderType_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar5,(allocator<char> *)&local_3e8);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,0x99df33);
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_320[0].field_2._0_8_ = *psVar11;
        local_320[0].field_2._8_8_ = plVar6[3];
        local_320[0]._M_dataplus._M_p = (pointer)&local_320[0].field_2;
      }
      else {
        local_320[0].field_2._0_8_ = *psVar11;
        local_320[0]._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_320[0]._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      NegativeTestContext::beginSection(ctx,local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
        operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_1a8[0] != local_198) {
        operator_delete(local_1a8[0],local_198[0] + 1);
      }
      local_4b8 = (size_type *)0x0;
      do {
        shaderType = (ShaderType)psVar11;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        CVar4.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
        pcVar5 = glu::getGLSLVersionDeclaration(bVar3 | GLSL_VERSION_310_ES);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffffb28 + (int)local_1a8[0][-3] + 0x330);
        }
        else {
          sVar7 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        (anonymous_namespace)::getShaderInitialization_abi_cxx11_
                  (&local_3e8,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType_00,shaderType);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_3e8._M_dataplus._M_p,
                            local_3e8._M_string_length);
        piVar9 = (int *)(&DAT_0099e9e0 + (long)local_4b8 * 0x1c);
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        local_408.field_2._M_allocated_capacity._0_4_ = 0x706d6173;
        local_408._M_string_length = 7;
        local_408.field_2._M_allocated_capacity._4_4_ = 0x72656c;
        declareShaderUniform
                  (&local_368,*(DataType *)(&UNK_0099e9e4 + (long)local_4b8 * 0x1c),&local_408);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_368._M_dataplus._M_p,local_368._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main(void)\n",0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tmediump ",9);
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        local_428.field_2._M_allocated_capacity._0_2_ = 0x50;
        local_428._M_string_length = 1;
        declareAndInitializeShaderVariable(&local_388,piVar9[2],&local_428);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_388._M_dataplus._M_p,local_388._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    mediump ",0xc);
        bVar3 = (char)piVar9[5] != '\0';
        pcVar5 = SSBOArrayLengthTests::init::arraysSized + 1;
        if (bVar3) {
          pcVar5 = "const ";
        }
        lVar12 = 0;
        if (bVar3) {
          lVar12 = 6;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,lVar12);
        DVar1 = piVar9[3];
        iVar2 = piVar9[6];
        local_468 = (char *)&local_458;
        local_458 = 0x7366666f;
        local_460 = 7;
        uStack_454 = 0x737465;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        pcVar5 = glu::getDataTypeName(DVar1);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffffb28 +
                          (int)*(undefined8 *)(local_320[0]._M_dataplus._M_p + -0x18) + 0x1b8);
        }
        else {
          sVar7 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar5,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,local_468,local_460);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
        pcVar5 = glu::getDataTypeName(DVar1);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar5,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[](",3);
        if (0 < iVar2) {
          iVar15 = 0;
          do {
            pcVar5 = glu::getDataTypeName(DVar1);
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)&stack0xfffffffffffffb28 +
                              (int)*(undefined8 *)(local_320[0]._M_dataplus._M_p + -0x18) + 0x1b8);
            }
            else {
              sVar7 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar5,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"(",1);
            poVar10 = (ostream *)std::ostream::operator<<(local_320,0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
            pbVar13 = SSBOArrayLengthTests::init::arraysSized + 1;
            if (iVar15 < iVar2 + -1) {
              pbVar13 = (bool *)0x9ce644;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,pbVar13,(ulong)((uint)(iVar15 < iVar2 + -1) * 2));
            iVar15 = iVar15 + 1;
          } while (iVar2 != iVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,");",2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_3a8,local_3a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if (local_3a8 != local_398) {
          operator_delete(local_3a8,local_398[0] + 1);
        }
        if (local_468 != (char *)&local_458) {
          operator_delete(local_468,CONCAT44(uStack_454,local_458) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,
                          CONCAT62(local_428.field_2._M_allocated_capacity._2_6_,
                                   local_428.field_2._M_allocated_capacity._0_2_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,
                          CONCAT44(local_408.field_2._M_allocated_capacity._4_4_,
                                   local_408.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
        }
        if (*piVar9 == 0) {
          DVar1 = piVar9[4];
          if (DVar1 == TYPE_LAST) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"\ttextureGatherOffsets(sampler, P, offsets);\n",0x2c);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tmediump ",9);
            local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
            local_488.field_2._M_allocated_capacity._0_4_ = 0x706d6f63;
            local_488._M_string_length = 4;
            local_488.field_2._M_allocated_capacity._4_4_ =
                 local_488.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            declareAndInitializeShaderVariable(local_320,DVar1,&local_488);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,
                                local_320[0]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\ttextureGatherOffsets(sampler, P, offsets, comp);\n",0x32);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
              operator_delete(local_320[0]._M_dataplus._M_p,
                              local_320[0].field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._M_dataplus._M_p != &local_488.field_2) {
              lVar12 = CONCAT44(local_488.field_2._M_allocated_capacity._4_4_,
                                local_488.field_2._M_allocated_capacity._0_4_);
              _Var14._M_p = local_488._M_dataplus._M_p;
              goto LAB_005da7f3;
            }
          }
        }
        else if (*piVar9 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tmediump ",9);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          local_4a8.field_2._M_allocated_capacity._0_4_ = 0x5a666572;
          local_4a8._M_string_length = 4;
          local_4a8.field_2._M_allocated_capacity._4_4_ =
               local_4a8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          declareAndInitializeShaderVariable(local_320,piVar9[4],&local_4a8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,
                              local_320[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\ttextureGatherOffsets(sampler, P, refZ, offsets);\n",0x32);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
            operator_delete(local_320[0]._M_dataplus._M_p,
                            local_320[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            lVar12 = CONCAT44(local_4a8.field_2._M_allocated_capacity._4_4_,
                              local_4a8.field_2._M_allocated_capacity._0_4_);
            _Var14._M_p = local_4a8._M_dataplus._M_p;
LAB_005da7f3:
            operator_delete(_Var14._M_p,lVar12 + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_448[0] = local_438;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_448,local_3c8,local_3c0 + (long)local_3c8);
        shaderSource_00._M_string_length = (size_type)ctx;
        shaderSource_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb28;
        shaderSource_00.field_2._M_allocated_capacity = (size_type)piVar9;
        shaderSource_00.field_2._8_4_ = in_stack_fffffffffffffb40;
        shaderSource_00.field_2._12_4_ = shaderType_00;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType_00,
                     (ShaderType)local_448[0],shaderSource_00);
        if (local_448[0] != local_438) {
          operator_delete(local_448[0],local_438[0] + 1);
        }
        if (local_3c8 != local_3b8) {
          operator_delete(local_3c8,local_3b8[0] + 1);
        }
        psVar11 = (size_type *)((long)local_4b8 + 1);
        local_4b8 = psVar11;
      } while (psVar11 != (size_type *)0x1c);
      NegativeTestContext::endSection(ctx);
      lVar12 = local_348;
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 6) {
      NegativeTestContext::endSection(ctx);
      return;
    }
  } while( true );
}

Assistant:

void texture_gather_offsets (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_EXT_gpu_shader5"),
		"This test requires a context version 3.2 or higher.");

	const struct TextureGatherOffsetsTestSpec testSpecs[] =
	{
			//mode										samplerDataType						pDataType				offsetsDataType			fourthArgument		offsetIsConst	offsetArraySize
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
	};

	ctx.beginSection("textureGatherOffsets");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int specNdx = 0; specNdx < DE_LENGTH_OF_ARRAY(testSpecs); ++specNdx)
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffsets(ctx, s_shaders[shaderNdx], testSpecs[specNdx]));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}